

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

char * strarray_get(strarray *array,size_t idx)

{
  char *pcVar1;
  size_t sVar2;
  char *__s;
  bool bVar3;
  
  pcVar1 = array->value;
  for (__s = pcVar1; (__s != (char *)0x0 && (__s < pcVar1 + array->length)); __s = __s + sVar2 + 1)
  {
    bVar3 = idx == 0;
    idx = idx - 1;
    if (bVar3) {
      return __s;
    }
    sVar2 = strlen(__s);
  }
  return (char *)0x0;
}

Assistant:

char *
strarray_get(const struct strarray *array, size_t idx) {
  size_t count = 0;
  char *ptr;

  strarray_for_each_element(array, ptr) {
    if (count == idx) {
      return ptr;
    }
    count++;
  }
  return NULL;
}